

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_Perseus.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  NullPlanner *this;
  PerseusPOMDPPlanner *this_00;
  char *arg;
  undefined8 in_RSI;
  undefined4 in_EDI;
  E *e;
  BeliefSet B;
  PerseusStationary *PS;
  Perseus *P;
  NullPlanner *np;
  PlanningUnitMADPDiscreteParameters params;
  DecPOMDPDiscreteInterface *decpomdp;
  QAVParameters qavParams;
  size_t horizon;
  Arguments args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  Arguments *pAVar2;
  Arguments *in_stack_fffffffffffffc60;
  PerseusBGPlanner *in_stack_fffffffffffffc68;
  Arguments *in_stack_fffffffffffffc70;
  undefined1 local_358 [32];
  MultiAgentDecisionProcessInterface local_338 [32];
  string local_318 [32];
  undefined1 local_2f8 [64];
  Arguments *local_2b8;
  Arguments *local_2b0;
  PlanningUnitDecPOMDPDiscrete *local_2a8;
  PlanningUnitMADPDiscreteParameters local_299 [9];
  DecPOMDPDiscreteInterface *local_290;
  undefined1 local_288 [168];
  int local_1e0;
  double local_1d8;
  int local_1d0;
  byte local_1cc;
  undefined4 local_158;
  undefined4 local_154;
  BnB_JointTypeOrdering local_150;
  int local_148;
  int local_130;
  int local_114;
  undefined8 local_10;
  undefined4 local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffc70);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,local_288 + 0x40);
  if ((local_1cc & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Perseus requires an infinite-horizon setting (use --inf)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_288._48_4_ = 1;
  }
  else {
    if ((local_1cc & 1) == 0) {
      local_288._40_8_ = SEXT48(local_1d0);
    }
    else {
      local_288._40_8_ = 999999;
    }
    Perseus::ProcessArguments((Arguments *)local_288);
    local_290 = (DecPOMDPDiscreteInterface *)
                ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)(local_288 + 0x40))
    ;
    if ((local_1d8 != -1.0) || (NAN(local_1d8))) {
      (**(code **)(*(long *)(local_290 + *(long *)(*(long *)local_290 + -0xb0)) + 0x68))
                (local_1d8,local_290 + *(long *)(*(long *)local_290 + -0xb0));
    }
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_299);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_299,0));
    if (local_1e0 == 0) {
      PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_299,false);
    }
    else {
      PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_299,true);
    }
    this = (NullPlanner *)operator_new(0x338);
    NullPlanner::NullPlanner(this,local_288._40_8_,local_290,local_299);
    local_2b8 = (Arguments *)0x0;
    local_2a8 = (PlanningUnitDecPOMDPDiscrete *)this;
    if (local_130 == 0) {
      this_00 = (PerseusPOMDPPlanner *)operator_new(0x200);
      PerseusPOMDPPlanner::PerseusPOMDPPlanner(this_00,local_2a8);
      in_stack_fffffffffffffc70 = (Arguments *)0x0;
      local_2b8 = in_stack_fffffffffffffc70;
      if (this_00 != (PerseusPOMDPPlanner *)0x0) {
        in_stack_fffffffffffffc70 = (Arguments *)(this_00 + 8);
        local_2b8 = in_stack_fffffffffffffc70;
      }
    }
    else {
      if (local_130 != 1) {
        arg = (char *)__cxa_allocate_exception(0x28);
        E::E((E *)in_stack_fffffffffffffc60,arg);
        __cxa_throw(arg,&E::typeinfo,E::~E);
      }
      in_stack_fffffffffffffc68 = (PerseusBGPlanner *)operator_new(0x218);
      PerseusBGPlanner::PerseusBGPlanner
                (in_stack_fffffffffffffc68,local_2a8,(QAVParameters *)local_288);
      in_stack_fffffffffffffc60 = (Arguments *)0x0;
      local_2b8 = in_stack_fffffffffffffc60;
      if (in_stack_fffffffffffffc68 != (PerseusBGPlanner *)0x0) {
        in_stack_fffffffffffffc60 = (Arguments *)(in_stack_fffffffffffffc68 + 0x18);
        local_2b8 = in_stack_fffffffffffffc60;
      }
    }
    local_2b0 = local_2b8;
    Perseus::SetVerbose((Perseus *)local_2b8,local_288._64_4_);
    if (local_158 != 0) {
      Perseus::SetMinimumNumberOfIterations((Perseus *)local_2b0,local_158);
    }
    if (local_150 != IdentityMapping) {
      Perseus::SetInitializeWithZero((Perseus *)local_2b0,true);
    }
    if (local_154 != 0) {
      Perseus::SetInitializeWithImmediateReward((Perseus *)local_2b0,true);
    }
    pAVar2 = local_2b0;
    Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)local_2f8);
    std::operator+(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    Perseus::SetIdentification((string *)pAVar2);
    std::__cxx11::string::~string((string *)(local_2f8 + 0x20));
    std::__cxx11::string::~string((string *)local_2f8);
    pAVar2 = local_2b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    directories::MADPGetResultsFilename
              (local_318,local_338,(Arguments *)(local_290 + *(long *)(*(long *)local_290 + -0x40)))
    ;
    Perseus::SetResultsFilename((string *)pAVar2);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string((string *)local_338);
    std::allocator<char>::~allocator((allocator<char> *)(local_358 + 0x1f));
    if (-1 < (int)local_288._64_4_) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Sampling ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_148);
      std::operator<<(poVar1," beliefs");
    }
    std::ostream::flush();
    AlphaVectorPlanning::SampleBeliefs((Arguments *)local_358);
    PerseusStationary::SetBeliefSet((vector *)local_2b8);
    if (-1 < (int)local_288._64_4_) {
      poVar1 = std::operator<<((ostream *)&std::cout,".");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    if (local_114 != 0) {
      Perseus::SetComputeVectorForEachBelief((Perseus *)local_2b0,true);
    }
    Perseus::SetDryrun((Perseus *)local_2b0,true);
    (**(code **)(*(long *)local_2b0 + 0x68))();
    if (-1 < (int)local_288._64_4_) {
      TimedAlgorithm::PrintTimersSummary();
    }
    std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~vector
              ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)pAVar2);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_299);
    local_288._48_4_ = 0;
  }
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x1058fa);
  if (local_288._48_4_ == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    try
    {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    if(!args.infiniteHorizon)
    {
        cout << "Perseus requires an infinite-horizon setting (use --inf)" << endl;
        return(1);
    }

    size_t horizon;
    if(args.infiniteHorizon)
        horizon=MAXHORIZON;
    else
        horizon=args.horizon;
    
    QAVParameters qavParams=Perseus::ProcessArguments(args);

    DecPOMDPDiscreteInterface* decpomdp;
    decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);

    /*
    if(args.isTOI)
    {
        // necessary for running Perseus
        if(args.sparse)
        {
            cout << "Creating centralized sparse models"; cout.flush();
            dynamic_cast<TOIDecPOMDPDiscrete*>(decpomdp)->CreateCentralizedSparseModels();
            cout << "." << endl;
        }
        else
        {
            cout << "Creating centralized full models"; cout.flush();
            dynamic_cast<TOIDecPOMDPDiscrete*>(decpomdp)->CreateCentralizedFullModels();
            cout << "." << endl;
        }
    }*/

    if(args.discount!=-1)
        decpomdp->SetDiscount(args.discount);

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    NullPlanner *np=new NullPlanner(horizon, decpomdp, &params);
    
    Perseus *P;
    PerseusStationary *PS=0;
    switch(args.backup)
    {
    case POMDP:
        PS=new PerseusPOMDPPlanner(np);
        break;
    case BG:
        PS=new PerseusBGPlanner(np,qavParams);
        break;
    default:
        throw(E("PerseusBackupType is unknown"));
    }
    P=PS;

    P->SetVerbose(args.verbose);
    if(args.minimumNrIterations)
        P->SetMinimumNumberOfIterations(args.minimumNrIterations);
    if(args.initializeWithZero)
        P->SetInitializeWithZero(true);
    if(args.initializeWithImmediateReward)
        P->SetInitializeWithImmediateReward(true);
    P->SetIdentification("Perseus" + Perseus::BackupTypeToString(qavParams));
    P->SetResultsFilename(directories::MADPGetResultsFilename("POMDP",
                                                              *decpomdp,args));
    if(args.verbose >= 0)
        cout << "Sampling " << args.nrBeliefs << " beliefs"; cout.flush();

    BeliefSet B=P->SampleBeliefs(args);

    PS->SetBeliefSet(B);

    if(args.verbose >= 0)
        cout << "." << endl;

    if(args.computeVectorForEachBelief)
        P->SetComputeVectorForEachBelief(true);
    P->SetDryrun(true);
    P->Plan();

    if(args.verbose >= 0)
        P->PrintTimersSummary();
    }
    catch(E& e){ e.Print(); }

    return(0);
}